

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab3-0.c
# Opt level: O2

int checkerBig2(void)

{
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar1;
  int iVar2;
  bool bVar3;
  undefined8 uStack_28;
  int n;
  
  uStack_28 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar2 = -1;
  }
  else {
    iVar2 = 2000000;
    do {
      bVar3 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar3) {
        iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
        fclose(__stream);
        if (iVar2 != 0) goto LAB_00102828;
        puts("PASSED");
        iVar2 = 0;
        goto LAB_00102837;
      }
      pcVar1 = ScanInt((FILE *)__stream,&n);
      if (pcVar1 != "PASSED") goto LAB_001027fb;
    } while (n == 0);
    printf("wrong output -- ");
LAB_001027fb:
    fclose(__stream);
LAB_00102828:
    puts("FAILED");
    iVar2 = 1;
  }
LAB_00102837:
  testN = testN + 1;
  return iVar2;
}

Assistant:

static int checkerBig2(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 2000000; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if (n != 0) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}